

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netgroup.cpp
# Opt level: O0

void __thiscall
NetGroupManager::ASMapHealthCheck
          (NetGroupManager *this,vector<CNetAddr,_std::allocator<CNetAddr>_> *clearnet_addrs)

{
  string_view source_file;
  string_view logging_function;
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  long in_FS_OFFSET;
  CNetAddr *addr;
  vector<CNetAddr,_std::allocator<CNetAddr>_> *__range1;
  unsigned_long *in_stack_00000090;
  unsigned_long *in_stack_00000098;
  int *in_stack_000000a0;
  uint32_t asn;
  const_iterator __end1;
  const_iterator __begin1;
  int unmapped_count;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> clearnet_asns;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffedc;
  vector<CNetAddr,_std::allocator<CNetAddr>_> *in_stack_fffffffffffffee0;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffef8;
  LogFlags in_stack_ffffffffffffff40;
  reference in_stack_ffffffffffffff48;
  int source_line;
  CNetAddr *in_stack_ffffffffffffff70;
  NetGroupManager *in_stack_ffffffffffffff78;
  ConstevalFormatString<3U> in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff90 [12];
  uint32_t in_stack_ffffffffffffff9c;
  undefined1 local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_38,0,0x30);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  cVar2 = std::vector<CNetAddr,_std::allocator<CNetAddr>_>::begin(in_stack_fffffffffffffee0);
  cVar3 = std::vector<CNetAddr,_std::allocator<CNetAddr>_>::end(in_stack_fffffffffffffee0);
  while( true ) {
    source_line = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
    bVar1 = __gnu_cxx::
            operator==<const_CNetAddr_*,_std::vector<CNetAddr,_std::allocator<CNetAddr>_>_>
                      ((__normal_iterator<const_CNetAddr_*,_std::vector<CNetAddr,_std::allocator<CNetAddr>_>_>
                        *)in_stack_fffffffffffffee8,
                       (__normal_iterator<const_CNetAddr_*,_std::vector<CNetAddr,_std::allocator<CNetAddr>_>_>
                        *)in_stack_fffffffffffffee0);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffff48 =
         __gnu_cxx::
         __normal_iterator<const_CNetAddr_*,_std::vector<CNetAddr,_std::allocator<CNetAddr>_>_>::
         operator*((__normal_iterator<const_CNetAddr_*,_std::vector<CNetAddr,_std::allocator<CNetAddr>_>_>
                    *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    in_stack_ffffffffffffff9c = GetMappedAS(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    if (in_stack_ffffffffffffff9c != 0) {
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                (in_stack_fffffffffffffee8,(value_type_conflict2 *)in_stack_fffffffffffffee0);
    }
    __gnu_cxx::
    __normal_iterator<const_CNetAddr_*,_std::vector<CNetAddr,_std::allocator<CNetAddr>_>_>::
    operator++((__normal_iterator<const_CNetAddr_*,_std::vector<CNetAddr,_std::allocator<CNetAddr>_>_>
                *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  std::vector<CNetAddr,_std::allocator<CNetAddr>_>::size
            ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::size
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  uVar4 = 2;
  logging_function._M_str = (char *)cVar2._M_current;
  logging_function._M_len = (size_t)cVar3._M_current;
  source_file._M_str._4_4_ = in_stack_ffffffffffffff9c;
  source_file._0_12_ = in_stack_ffffffffffffff90;
  LogPrintFormatInternal<unsigned_long,unsigned_long,int>
            (logging_function,source_file,source_line,in_stack_ffffffffffffff40,
             (Level)clearnet_addrs,in_stack_ffffffffffffff88,in_stack_00000090,in_stack_00000098,
             in_stack_000000a0);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffedc,uVar4));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void NetGroupManager::ASMapHealthCheck(const std::vector<CNetAddr>& clearnet_addrs) const {
    std::set<uint32_t> clearnet_asns{};
    int unmapped_count{0};

    for (const auto& addr : clearnet_addrs) {
        uint32_t asn = GetMappedAS(addr);
        if (asn == 0) {
            ++unmapped_count;
            continue;
        }
        clearnet_asns.insert(asn);
    }

    LogPrintf("ASMap Health Check: %i clearnet peers are mapped to %i ASNs with %i peers being unmapped\n", clearnet_addrs.size(), clearnet_asns.size(), unmapped_count);
}